

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lipm-dcm-estimator.cpp
# Opt level: O2

void __thiscall
stateObservation::LipmDcmEstimator::resetWithMeasurements
          (LipmDcmEstimator *this,Vector2 *measuredDcm,Vector2 *measuredZMP,Matrix2 *yaw,
          bool measurementIsWithBias,Vector2 *initBias,Vector2 *initBiasuncertainty)

{
  double dVar1;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar2;
  SrcEvaluatorType srcEvaluator;
  LinearKalmanFilter *this_00;
  undefined3 in_register_00000081;
  Matrix2 initBiasCov;
  Matrix4 P;
  Vector4 x;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_158;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *local_138 [2];
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_128;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *local_100;
  Matrix2 *local_f8;
  Matrix<double,_4,_4,_0,_4,_4> local_e8;
  Matrix<double,_4,_1,_0,_4,_1> local_68;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *local_40 [2];
  
  this_00 = &this->filter_;
  KalmanFilterBase::reset(&this_00->super_KalmanFilterBase);
  dVar1 = (measuredZMP->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
          m_data.array[1];
  (this->previousZmp_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
  .array[0] = (measuredZMP->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
              m_data.array[0];
  (this->previousZmp_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
  .array[1] = dVar1;
  Eigen::internal::call_assignment<Eigen::Matrix<double,2,2,0,2,2>,Eigen::Matrix<double,2,2,0,2,2>>
            (&this->previousOrientation_,yaw);
  if (CONCAT31(in_register_00000081,measurementIsWithBias) == 0) {
    Eigen::CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>>::
    CommaInitializer<Eigen::Matrix<double,2,1,0,2,1>>
              ((CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>> *)&local_e8,&local_68,
               (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)measuredDcm);
    Eigen::CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>> *)&local_e8,
               (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)initBias);
  }
  else {
    local_158.m_xpr = (Matrix<double,_4,_4,_0,_4,_4> *)measuredDcm;
    local_158.m_row = (Index)initBias;
    Eigen::CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>>::
    CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::Matrix<double,2,1,0,2,1>const>>
              ((CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>> *)&local_e8,&local_68,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)&local_158);
    Eigen::CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>> *)&local_e8,
               (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)initBias);
  }
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&local_e8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_e8,
             (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&local_68);
  ZeroDelayObserver::setState((ZeroDelayObserver *)this_00,(StateVector *)&local_e8,0);
  free((void *)local_e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0]);
  if (measurementIsWithBias) {
    Vec2ToSqDiag_((Matrix2 *)&local_158,initBiasuncertainty);
    local_f8 = &this->R_;
    local_100 = &local_158;
    Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::
    CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,2,2,0,2,2>const,Eigen::Matrix<double,2,2,0,2,2>const>>
              ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)&local_128,&local_e8,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                *)&local_100);
    local_138[0] = &local_158;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)&local_128,
                        (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                         *)local_138);
    local_40[0] = &local_158;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar2,
                        (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                         *)local_40);
    Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar2,
               (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&local_158);
    pCVar2 = &local_128;
  }
  else {
    Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::
    CommaInitializer<Eigen::Matrix<double,2,2,0,2,2>>
              ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)&local_158,&local_e8,
               (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&this->R_);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Zero();
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)&local_158,
                        (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                         *)&local_100);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Zero();
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar2,
                        (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
                         *)local_138);
    Vec2ToSqDiag_((Matrix2 *)&local_128,initBiasuncertainty);
    Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar2,
               (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&local_128);
    pCVar2 = &local_158;
  }
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::finished(pCVar2);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_158,
             (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_e8);
  KalmanFilterBase::setStateCovariance(&this_00->super_KalmanFilterBase,(Pmatrix *)&local_158);
  free(local_158.m_xpr);
  return;
}

Assistant:

void LipmDcmEstimator::resetWithMeasurements(const Vector2 & measuredDcm,
                                             const Vector2 & measuredZMP,
                                             const Matrix2 & yaw,
                                             bool measurementIsWithBias,
                                             const Vector2 & initBias,
                                             const Vector2 & initBiasuncertainty)

{
  filter_.reset();
  previousZmp_ = measuredZMP;
  previousOrientation_ = yaw;

  Vector4 x;

  /// initialize the state using the measurement
  if(measurementIsWithBias)
  {
    x << measuredDcm - initBias, initBias;
  }
  else
  {
    x << measuredDcm, initBias;
  }

  filter_.setState(x, 0);
  Matrix4 P;

  if(measurementIsWithBias)
  {
    Matrix2 initBiasCov = Vec2ToSqDiag_(initBiasuncertainty);
    /// The state and the
    // clang-format off
    P<< initBiasCov+R_, -initBiasCov,
       -initBiasCov,     initBiasCov;
    // clang-format on
  }
  else
  {
    // clang-format off
    P<< R_,               Matrix2::Zero(),
        Matrix2::Zero(),  Vec2ToSqDiag_(initBiasuncertainty);
    // clang-format on
  }

  filter_.setStateCovariance(P);
}